

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::
write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::dec_writer>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
           *this,int num_digits,string_view prefix,basic_format_specs<char> *spec,dec_writer f)

{
  undefined4 uVar1;
  undefined4 uVar2;
  type tVar3;
  alignment aVar4;
  uint uVar5;
  alignment aVar6;
  size_t sVar7;
  int in_ESI;
  align_spec *in_R8;
  align_spec as;
  size_t padding;
  char_type fill;
  size_t size;
  undefined4 in_stack_ffffffffffffffb0;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  *this_00;
  basic_string_view<char> local_10;
  
  sVar7 = basic_string_view<char>::size(&local_10);
  tVar3 = internal::to_unsigned<int>(in_ESI);
  align_spec::fill(in_R8);
  this_00 = (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
             *)0x0;
  aVar4 = align_spec::align(in_R8);
  if (aVar4 == ALIGN_NUMERIC) {
    uVar5 = align_spec::width(in_R8);
    if (sVar7 + tVar3 < (ulong)uVar5) {
      uVar5 = align_spec::width(in_R8);
      this_00 = (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
                 *)((ulong)uVar5 - (sVar7 + tVar3));
      align_spec::width(in_R8);
    }
  }
  else if (in_ESI < (int)in_R8[1].width_) {
    basic_string_view<char>::size(&local_10);
    internal::to_unsigned<int>(in_R8[1].width_);
    tVar3 = internal::to_unsigned<int>(in_R8[1].width_ - in_ESI);
    this_00 = (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
               *)(ulong)tVar3;
  }
  uVar1 = in_R8->width_;
  uVar2 = in_R8->fill_;
  aVar4 = in_R8->align_;
  aVar6 = align_spec::align(in_R8);
  if (aVar6 == ALIGN_DEFAULT) {
    aVar4 = ALIGN_RIGHT;
  }
  write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::dec_writer>>
            (this_00,(align_spec *)CONCAT44(aVar4,uVar2),
             (padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>::int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_>::dec_writer>
              *)CONCAT44(uVar1,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix,
                 const Spec &spec, F f) {
    std::size_t size = prefix.size() + internal::to_unsigned(num_digits);
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = 0;
    if (spec.align() == ALIGN_NUMERIC) {
      if (spec.width() > size) {
        padding = spec.width() - size;
        size = spec.width();
      }
    } else if (spec.precision > num_digits) {
      size = prefix.size() + internal::to_unsigned(spec.precision);
      padding = internal::to_unsigned(spec.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    align_spec as = spec;
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    write_padded(as, padded_int_writer<F>{size, prefix, fill, padding, f});
  }